

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.cpp
# Opt level: O2

void duckdb::roaring::AppendToArray<false>
               (ContainerCompressionState *state,bool null,uint16_t amount)

{
  uint uVar1;
  ushort uVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ushort uVar10;
  uint uVar11;
  undefined7 in_register_00000031;
  ulong uVar12;
  uint uVar13;
  bool bVar14;
  uint local_48;
  
  if ((int)CONCAT71(in_register_00000031,null) == 0) {
    uVar7 = CONCAT71(in_register_00000031,null) & 0xffffffff;
    uVar2 = state->array_idx[uVar7];
    uVar8 = (ulong)uVar2;
    uVar9 = (ulong)(uint)amount;
    uVar11 = (uint)uVar2 + (uint)amount;
    if (uVar11 < 0xf9) {
      uVar10 = state->appended_count;
      puVar3 = state->compressed_arrays[uVar7];
      puVar4 = state->array_counts[uVar7];
      uVar13 = 0;
      while( true ) {
        local_48 = (uint)uVar2;
        if (amount <= (ushort)uVar13) break;
        uVar1 = (uint)uVar10 + (uVar13 & 0xffff);
        uVar5 = uVar1 & 0xff;
        if ((ushort)uVar13 != 0) {
          uVar5 = 0;
        }
        uVar6 = 0x100 - uVar5;
        if ((ushort)(amount - uVar13) < (ushort)(0x100 - uVar5)) {
          uVar6 = amount - uVar13;
        }
        for (uVar12 = 0; (uVar6 & 0xff) != uVar12; uVar12 = uVar12 + 1) {
          puVar3[uVar12 + ((uVar13 & 0xffff) + local_48)] = (char)uVar5 + (char)uVar12;
        }
        puVar4[uVar1 >> 8] = puVar4[uVar1 >> 8] + (char)uVar6;
        uVar13 = uVar13 + (uVar6 & 0xff);
      }
      if (uVar11 < 8) {
        while (bVar14 = uVar9 != 0, uVar9 = uVar9 - 1, bVar14) {
          state->arrays[uVar7][uVar8] = uVar10;
          uVar8 = uVar8 + 1;
          uVar10 = uVar10 + 1;
        }
      }
      state->array_idx[uVar7] = state->array_idx[uVar7] + amount;
    }
    return;
  }
  return;
}

Assistant:

inline void AppendToArray(ContainerCompressionState &state, bool null, uint16_t amount) {
	if (DUCKDB_LIKELY(INVERTED != null)) {
		return;
	}

	auto current_array_idx = state.array_idx[null];
	if (current_array_idx + amount > MAX_ARRAY_IDX) {
		return;
	}
	auto appended_count = state.appended_count;
	auto array_count = state.array_counts[null];
	auto compressed_array = state.compressed_arrays[null];
	uint16_t appended = 0;
	while (appended < amount) {
		uint16_t remaining = amount - appended;
		uint8_t segment_offset = appended ? 0 : (appended_count + appended) & (COMPRESSED_SEGMENT_SIZE - 1);
		uint8_t to_append =
		    static_cast<uint8_t>(MinValue<uint16_t>(remaining, COMPRESSED_SEGMENT_SIZE - segment_offset));
		for (uint8_t i = 0; i < to_append; i++) {
			auto index = current_array_idx + appended + i;
			compressed_array[index] = segment_offset + i;
		}

		idx_t segment_index = (appended_count + appended) / COMPRESSED_SEGMENT_SIZE;
		array_count[segment_index] += to_append;
		appended += to_append;
	}

	if (current_array_idx + amount < COMPRESSED_ARRAY_THRESHOLD) {
		auto &array = state.arrays[null];
		for (uint16_t i = 0; i < amount; i++) {
			array[current_array_idx + i] = appended_count + i;
		}
	}
	state.array_idx[null] += amount;
}